

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

void __thiscall
testing::Matcher<const_std::pair<int,_phmap::priv::NonStandardLayout>_&>::Matcher
          (Matcher<const_std::pair<int,_phmap::priv::NonStandardLayout>_&> *this,
          pair<int,_phmap::priv::NonStandardLayout> *value)

{
  int iVar1;
  pointer pcVar2;
  long *local_90;
  long local_88;
  long local_80 [2];
  undefined1 local_70 [16];
  _Alloc_hider local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  MatcherBase<const_std::pair<int,_phmap::priv::NonStandardLayout>_&> local_40;
  
  (this->super_MatcherBase<const_std::pair<int,_phmap::priv::NonStandardLayout>_&>).vtable_ =
       (VTable *)0x0;
  (this->super_MatcherBase<const_std::pair<int,_phmap::priv::NonStandardLayout>_&>).buffer_.ptr =
       (void *)0x0;
  (this->super_MatcherBase<const_std::pair<int,_phmap::priv::NonStandardLayout>_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00325d80;
  iVar1 = value->first;
  pcVar2 = (value->second).value._M_dataplus._M_p;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,pcVar2 + (value->second).value._M_string_length);
  local_70._8_8_ = &PTR__NonStandardLayout_00323508;
  local_70._0_4_ = iVar1;
  local_60._M_p = (pointer)&local_50;
  std::__cxx11::string::_M_construct<char*>((string *)&local_60,local_90,local_88 + (long)local_90);
  local_40.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00325df0;
  local_40.buffer_.ptr = (void *)0x0;
  local_40.vtable_ =
       (VTable *)
       internal::MatcherBase<std::pair<int,phmap::priv::NonStandardLayout>const&>::
       GetVTable<testing::internal::MatcherBase<std::pair<int,phmap::priv::NonStandardLayout>const&>::ValuePolicy<testing::internal::EqMatcher<std::pair<int,phmap::priv::NonStandardLayout>>,false>>()
       ::kVTable;
  internal::MatcherBase<std::pair<int,phmap::priv::NonStandardLayout>const&>::
  ValuePolicy<testing::internal::EqMatcher<std::pair<int,phmap::priv::NonStandardLayout>>,false>::
  Init<testing::internal::EqMatcher<std::pair<int,phmap::priv::NonStandardLayout>>>
            (&local_40,(EqMatcher<std::pair<int,_phmap::priv::NonStandardLayout>_> *)local_70);
  local_40.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00325d80;
  internal::MatcherBase<const_std::pair<int,_phmap::priv::NonStandardLayout>_&>::operator=
            (&this->super_MatcherBase<const_std::pair<int,_phmap::priv::NonStandardLayout>_&>,
             &local_40);
  internal::MatcherBase<const_std::pair<int,_phmap::priv::NonStandardLayout>_&>::~MatcherBase
            (&local_40);
  local_70._8_8_ = &PTR__NonStandardLayout_00323508;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_p != &local_50) {
    operator_delete(local_60._M_p,local_50._M_allocated_capacity + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  return;
}

Assistant:

Matcher<T>::Matcher(T value) {
  *this = Eq(value);
}